

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddLibraryRuntimeInfo(cmComputeLinkInformation *this,string *fullPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  string soname;
  string file;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  cmsys::SystemTools::GetFilenameName(&local_50,fullPath);
  this_00 = this->Makefile;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
  bVar2 = cmMakefile::IsOn(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if (bVar2) {
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = cmSystemTools::GuessLibraryInstallName(fullPath,&local_90);
    if (!bVar2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_00299455;
    }
    lVar5 = std::__cxx11::string::find((char *)&local_90,0x4d1793,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if (lVar5 == -1) goto LAB_00299455;
  }
  bVar2 = cmsys::RegularExpression::find
                    (&this->ExtractSharedLibraryName,local_50._M_dataplus._M_p,
                     &(this->ExtractSharedLibraryName).regmatch);
  if ((!bVar2) && (this->ArchivesMayBeShared == true)) {
    bVar3 = cmsys::RegularExpression::find
                      (&this->ExtractStaticLibraryName,local_50._M_dataplus._M_p,
                       &(this->ExtractStaticLibraryName).regmatch);
    bVar2 = bVar2 || bVar3;
  }
  if ((bVar2 == false) &&
     (lVar5 = std::__cxx11::string::find((char *)fullPath,0x4bc4da,0), lVar5 != -1)) {
    if ((AddLibraryRuntimeInfo(std::__cxx11::string_const&)::splitFramework == '\0') &&
       (iVar4 = __cxa_guard_acquire(&AddLibraryRuntimeInfo(std::__cxx11::string_const&)::
                                     splitFramework), iVar4 != 0)) {
      AddLibraryRuntimeInfo::splitFramework.regmatch.startp[0] = (char *)0x0;
      AddLibraryRuntimeInfo::splitFramework.regmatch.endp[0] = (char *)0x0;
      AddLibraryRuntimeInfo::splitFramework.regmatch.searchstring = (char *)0x0;
      AddLibraryRuntimeInfo::splitFramework.program = (char *)0x0;
      cmsys::RegularExpression::compile
                (&AddLibraryRuntimeInfo::splitFramework,"^(.*)/(.*).framework/(.*)$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   &AddLibraryRuntimeInfo::splitFramework,&__dso_handle);
      __cxa_guard_release(&AddLibraryRuntimeInfo(std::__cxx11::string_const&)::splitFramework);
    }
    bVar3 = cmsys::RegularExpression::find
                      (&AddLibraryRuntimeInfo::splitFramework,(fullPath->_M_dataplus)._M_p,
                       &AddLibraryRuntimeInfo::splitFramework.regmatch);
    if (bVar3) {
      if (AddLibraryRuntimeInfo::splitFramework.regmatch.startp[3] == (char *)0x0) {
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        local_90._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,AddLibraryRuntimeInfo::splitFramework.regmatch.startp[3],
                   AddLibraryRuntimeInfo::splitFramework.regmatch.endp[3]);
      }
      if (AddLibraryRuntimeInfo::splitFramework.regmatch.startp[2] == (char *)0x0) {
        local_70 = &local_60;
        local_68 = 0;
        local_60 = 0;
      }
      else {
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,AddLibraryRuntimeInfo::splitFramework.regmatch.startp[2],
                   AddLibraryRuntimeInfo::splitFramework.regmatch.endp[2]);
      }
      lVar5 = std::__cxx11::string::find((char *)&local_90,(ulong)local_70,0);
      bVar2 = lVar5 != -1;
    }
    else {
      bVar2 = false;
    }
    if (bVar3) {
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if ((bVar2 != false) &&
     (cmOrderDirectories::AddRuntimeLibrary(this->OrderRuntimeSearchPath,fullPath,(char *)0x0),
     this->LinkWithRuntimePath == true)) {
    cmOrderDirectories::AddRuntimeLibrary(this->OrderLinkerSearchPath,fullPath,(char *)0x0);
  }
LAB_00299455:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddLibraryRuntimeInfo(
  std::string const& fullPath)
{
  // Get the name of the library from the file name.
  bool is_shared_library = false;
  std::string file = cmSystemTools::GetFilenameName(fullPath);

  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // Check that @rpath is part of the install name.
    // If it isn't, return.
    std::string soname;
    if (!cmSystemTools::GuessLibraryInstallName(fullPath, soname)) {
      return;
    }

    if (soname.find("@rpath") == std::string::npos) {
      return;
    }
  }

  is_shared_library = this->ExtractSharedLibraryName.find(file);

  if (!is_shared_library) {
    // On some platforms (AIX) a shared library may look static.
    if (this->ArchivesMayBeShared) {
      if (this->ExtractStaticLibraryName.find(file)) {
        // This is the name of a shared library or archive.
        is_shared_library = true;
      }
    }
  }

  // It could be an Apple framework
  if (!is_shared_library) {
    if (fullPath.find(".framework") != std::string::npos) {
      static cmsys::RegularExpression splitFramework(
        "^(.*)/(.*).framework/(.*)$");
      if (splitFramework.find(fullPath) &&
          (std::string::npos !=
           splitFramework.match(3).find(splitFramework.match(2)))) {
        is_shared_library = true;
      }
    }
  }

  if (!is_shared_library) {
    return;
  }

  // Include this library in the runtime path ordering.
  this->OrderRuntimeSearchPath->AddRuntimeLibrary(fullPath);
  if (this->LinkWithRuntimePath) {
    this->OrderLinkerSearchPath->AddRuntimeLibrary(fullPath);
  }
}